

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * kj::Path::parseWin32Api(Path *__return_storage_ptr__,ArrayPtr<const_wchar_t> text)

{
  char cVar1;
  String *pSVar2;
  ArrayDisposer *pAVar3;
  char *pcVar4;
  long lVar5;
  Vector<kj::String> *pVVar6;
  long lVar7;
  undefined1 in_R9B;
  size_t sVar8;
  StringPtr path;
  EncodingResult<kj::String> utf8;
  Path local_58;
  undefined8 *local_40;
  EncodingResult<kj::String> local_38;
  
  decodeWideString(&local_38,text);
  pVVar6 = (Vector<kj::String> *)local_38.super_String.content.ptr;
  if (local_38.super_String.content.size_ == 0) {
    pVVar6 = (Vector<kj::String> *)0x2214ff;
  }
  lVar5 = local_38.super_String.content.size_ + (local_38.super_String.content.size_ == 0);
  if ((Vector<kj::String> *)((long)pVVar6 + lVar5 + -1) == pVVar6) {
    sVar8 = 1;
  }
  else {
    sVar8 = 1;
    lVar7 = 0;
    do {
      cVar1 = *(char *)((long)&(pVVar6->builder).ptr + lVar7);
      sVar8 = sVar8 + (cVar1 == '\\' || cVar1 == '/');
      lVar7 = lVar7 + 1;
    } while (lVar5 + -1 != lVar7);
  }
  local_58.parts.ptr =
       (String *)
       _::HeapArrayDisposer::allocateImpl
                 (0x18,0,sVar8,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_58.parts.disposer = (ArrayDisposer *)(local_58.parts.ptr + sVar8);
  local_40 = &_::HeapArrayDisposer::instance;
  pVVar6 = (Vector<kj::String> *)local_38.super_String.content.ptr;
  if (local_38.super_String.content.size_ == 0) {
    pVVar6 = (Vector<kj::String> *)0x2214ff;
  }
  path.content.ptr =
       (char *)(local_38.super_String.content.size_ + (local_38.super_String.content.size_ == 0));
  path.content.size_ = 1;
  local_58.parts.size_ = (size_t)local_58.parts.ptr;
  evalWin32Impl(__return_storage_ptr__,&local_58,pVVar6,path,(bool)in_R9B);
  pAVar3 = local_58.parts.disposer;
  sVar8 = local_58.parts.size_;
  pSVar2 = local_58.parts.ptr;
  if (local_58.parts.ptr != (String *)0x0) {
    local_58.parts.ptr = (String *)0x0;
    local_58.parts.size_ = 0;
    local_58.parts.disposer = (ArrayDisposer *)0x0;
    (**(code **)*local_40)
              (local_40,pSVar2,0x18,((long)(sVar8 - (long)pSVar2) >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pSVar2 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  sVar8 = local_38.super_String.content.size_;
  pcVar4 = local_38.super_String.content.ptr;
  if ((Vector<kj::String> *)local_38.super_String.content.ptr != (Vector<kj::String> *)0x0) {
    local_38.super_String.content.ptr = (char *)0x0;
    local_38.super_String.content.size_ = 0;
    (**(local_38.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_38.super_String.content.disposer,pcVar4,1,sVar8,sVar8,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::parseWin32Api(ArrayPtr<const wchar_t> text) {
  auto utf8 = decodeWideString(text);
  return evalWin32Impl(Vector<String>(countPartsWin32(utf8)), utf8, true);
}